

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O3

REF_STATUS
ref_split_edge_ratio
          (REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node,REF_BOOL *allowed)

{
  REF_DBL *pRVar1;
  int cell;
  REF_CELL ref_cell;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_INT RVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  undefined8 uVar8;
  char *pcVar9;
  REF_DBL ratio;
  REF_INT nodes [27];
  double local_c8;
  int local_bc;
  long local_b8;
  REF_NODE local_b0;
  REF_INT local_a8 [30];
  
  local_b0 = ref_grid->node;
  *allowed = 0;
  lVar6 = 0x28;
  if ((ref_grid->surf == 0) && (ref_grid->twod == 0)) {
    lVar6 = 0x50;
  }
  if (-1 < node0) {
    ref_cell = *(REF_CELL *)((long)ref_grid->cell + lVar6 + -0x10);
    pRVar2 = ref_cell->ref_adj;
    if ((node0 < pRVar2->nnode) && (local_b8 = (long)pRVar2->first[(uint)node0], local_b8 != -1)) {
      pRVar3 = pRVar2->item + local_b8;
      RVar4 = ref_cell->node_per;
      do {
        if (0 < RVar4) {
          cell = pRVar3->ref;
          local_bc = 0;
          do {
            if (ref_cell->c2n[ref_cell->size_per * cell + local_bc] == node1) {
              uVar5 = ref_cell_nodes(ref_cell,cell,local_a8);
              if (uVar5 != 0) {
                pcVar9 = "cell nodes";
                uVar8 = 0x28f;
LAB_001da6b1:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,uVar8,"ref_split_edge_ratio",(ulong)uVar5,pcVar9);
                return uVar5;
              }
              RVar4 = ref_cell->node_per;
              if (0 < RVar4) {
                lVar6 = 0;
                do {
                  if (local_a8[lVar6] == node0) {
                    local_a8[lVar6] = new_node;
                    RVar4 = ref_cell->node_per;
                  }
                  lVar6 = lVar6 + 1;
                } while (lVar6 < RVar4);
              }
              iVar7 = ref_cell->edge_per;
              if (0 < iVar7) {
                lVar6 = 0;
                do {
                  if ((local_a8[ref_cell->e2n[lVar6 * 2]] == new_node) ||
                     (local_a8[ref_cell->e2n[lVar6 * 2 + 1]] == new_node)) {
                    uVar5 = ref_node_ratio(local_b0,local_a8[ref_cell->e2n[lVar6 * 2]],
                                           local_a8[ref_cell->e2n[lVar6 * 2 + 1]],&local_c8);
                    if (uVar5 != 0) {
                      pcVar9 = "ratio node0";
                      uVar8 = 0x298;
                      goto LAB_001da6b1;
                    }
                    if ((local_c8 < ref_grid->adapt->post_min_ratio) ||
                       (pRVar1 = &ref_grid->adapt->post_max_ratio,
                       *pRVar1 <= local_c8 && local_c8 != *pRVar1)) goto LAB_001da634;
                    iVar7 = ref_cell->edge_per;
                  }
                  lVar6 = lVar6 + 1;
                } while (lVar6 < iVar7);
                RVar4 = ref_cell->node_per;
              }
              if (0 < RVar4) {
                lVar6 = 0;
                do {
                  if (local_a8[lVar6] == new_node) {
                    local_a8[lVar6] = node0;
                    RVar4 = ref_cell->node_per;
                  }
                  lVar6 = lVar6 + 1;
                } while (lVar6 < RVar4);
                if (0 < RVar4) {
                  lVar6 = 0;
                  do {
                    if (local_a8[lVar6] == node1) {
                      local_a8[lVar6] = new_node;
                      RVar4 = ref_cell->node_per;
                    }
                    lVar6 = lVar6 + 1;
                  } while (lVar6 < RVar4);
                }
              }
              iVar7 = ref_cell->edge_per;
              if (0 < iVar7) {
                lVar6 = 0;
                do {
                  if ((local_a8[ref_cell->e2n[lVar6 * 2]] == new_node) ||
                     (local_a8[ref_cell->e2n[lVar6 * 2 + 1]] == new_node)) {
                    uVar5 = ref_node_ratio(local_b0,local_a8[ref_cell->e2n[lVar6 * 2]],
                                           local_a8[ref_cell->e2n[lVar6 * 2 + 1]],&local_c8);
                    if (uVar5 != 0) {
                      pcVar9 = "ratio node0";
                      uVar8 = 0x2ac;
                      goto LAB_001da6b1;
                    }
                    if ((local_c8 < ref_grid->adapt->post_min_ratio) ||
                       (pRVar1 = &ref_grid->adapt->post_max_ratio,
                       *pRVar1 <= local_c8 && local_c8 != *pRVar1)) {
LAB_001da634:
                      *allowed = 0;
                      return 0;
                    }
                    iVar7 = ref_cell->edge_per;
                  }
                  lVar6 = lVar6 + 1;
                } while (lVar6 < iVar7);
                RVar4 = ref_cell->node_per;
              }
            }
            local_bc = local_bc + 1;
          } while (local_bc < RVar4);
        }
        pRVar3 = ref_cell->ref_adj->item;
        local_b8 = (long)pRVar3[(int)local_b8].next;
        if (local_b8 == -1) break;
        pRVar3 = pRVar3 + local_b8;
      } while( true );
    }
  }
  *allowed = 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_split_edge_ratio(REF_GRID ref_grid, REF_INT node0,
                                        REF_INT node1, REF_INT new_node,
                                        REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell_node;
  REF_INT node;
  REF_INT cell_edge, e0, e1;
  REF_DBL ratio;

  *allowed = REF_FALSE;

  if (ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) nodes[node] = new_node;
    }

    each_ref_cell_cell_edge(ref_cell, cell_edge) { /* limit ratio */
      e0 = nodes[ref_cell_e2n_gen(ref_cell, 0, cell_edge)];
      e1 = nodes[ref_cell_e2n_gen(ref_cell, 1, cell_edge)];
      if (e0 == new_node || e1 == new_node) {
        RSS(ref_node_ratio(ref_node, e0, e1, &ratio), "ratio node0");
        if (ratio < ref_grid_adapt(ref_grid, post_min_ratio) ||
            ratio > ref_grid_adapt(ref_grid, post_max_ratio)) {
          *allowed = REF_FALSE;
          return REF_SUCCESS;
        }
      }
    }

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (new_node == nodes[node]) nodes[node] = node0;
    }
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 == nodes[node]) nodes[node] = new_node;
    }

    each_ref_cell_cell_edge(ref_cell, cell_edge) { /* limit ratio */
      e0 = nodes[ref_cell_e2n_gen(ref_cell, 0, cell_edge)];
      e1 = nodes[ref_cell_e2n_gen(ref_cell, 1, cell_edge)];
      if (e0 == new_node || e1 == new_node) {
        RSS(ref_node_ratio(ref_node, e0, e1, &ratio), "ratio node0");
        if (ratio < ref_grid_adapt(ref_grid, post_min_ratio) ||
            ratio > ref_grid_adapt(ref_grid, post_max_ratio)) {
          *allowed = REF_FALSE;
          return REF_SUCCESS;
        }
      }
    }
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}